

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall Assembler::processWordSecondPass(Assembler *this,string *line)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int value;
  iterator iVar3;
  mapped_type *pmVar4;
  undefined8 *puVar5;
  pointer_____offset_0x10___ *ppuVar6;
  Assembler *this_01;
  undefined **ppuVar7;
  allocator<char> local_15a;
  allocator<char> local_159;
  smatch symbol;
  relocationTableEntry rT;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [32];
  smatch literal;
  
  literal.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  literal._M_begin._M_current = (char *)0x0;
  literal.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  literal.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,&literal,&literalReg_abi_cxx11_,0);
  if (bVar2) {
    this_01 = (Assembler *)local_68;
    std::__cxx11::string::string((string *)this_01,(string *)line);
    value = literalToDecimal(this_01,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    processWordHelper(this,value);
    locationCounter = locationCounter + 2;
LAB_0010abf4:
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&literal);
    return;
  }
  symbol.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  symbol._M_begin._M_current = (char *)0x0;
  symbol.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  symbol.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->symbolTable;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
          ::find(&this_00->_M_t,line);
  p_Var1 = &(this->symbolTable)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    ppuVar6 = &NotDefWordSecondPassError::typeinfo;
    ppuVar7 = &PTR__exception_0012ba50;
  }
  else {
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (line,&symbol,&symbolReg_abi_cxx11_,0);
    if (bVar2) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
              ::find(&this_00->_M_t,line);
      if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
                ::find(&this_00->_M_t,line);
        if (iVar3._M_node[3]._M_color == ~_S_red) {
          iVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
                  ::find(&this_00->_M_t,line);
          processWordHelper(this,*(int *)&iVar3._M_node[3].field_0x4);
          locationCounter = locationCounter + 2;
        }
        else {
          iVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
                  ::find(&this_00->_M_t,line);
          if (*(char *)&iVar3._M_node[3]._M_parent == '\0') {
            iVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
                    ::find(&this_00->_M_t,line);
            processWordHelper(this,*(int *)&iVar3._M_node[3].field_0x4);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_159);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_15a);
            relocationTableEntry::relocationTableEntry(&rT,0,&local_88,-1,&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_88);
            rT.offset = locationCounter;
            locationCounter = locationCounter + 2;
            std::__cxx11::string::assign((char *)&rT.typeOfRelocation);
            iVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
                    ::find(&this_00->_M_t,line);
            rT.value = iVar3._M_node[3]._M_color;
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>_>_>
                     ::operator[](&this->relocationTable,&currentSectionName_abi_cxx11_);
            std::__cxx11::
            list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>
            ::push_back(pmVar4,&rT);
          }
          else {
            processWordHelper(this,0);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_159);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_15a);
            relocationTableEntry::relocationTableEntry(&rT,0,&local_c8,-1,&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_c8);
            rT.offset = locationCounter;
            std::__cxx11::string::assign((char *)&rT.typeOfRelocation);
            iVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
                    ::find(&this_00->_M_t,line);
            rT.value = *(int *)&iVar3._M_node[3]._M_left;
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>_>_>
                     ::operator[](&this->relocationTable,&currentSectionName_abi_cxx11_);
            std::__cxx11::
            list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>
            ::push_back(pmVar4,&rT);
            locationCounter = locationCounter + 2;
          }
          relocationTableEntry::~relocationTableEntry(&rT);
        }
        std::
        _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&symbol);
        goto LAB_0010abf4;
      }
      ppuVar6 = &NotDefSymbol::typeinfo;
      ppuVar7 = &PTR__exception_0012ba78;
    }
    else {
      ppuVar6 = &AfterWordError::typeinfo;
      ppuVar7 = &PTR__exception_0012baa0;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = ppuVar7;
  __cxa_throw(puVar5,ppuVar6,std::exception::~exception);
}

Assistant:

void Assembler::processWordSecondPass(string line) {


    smatch literal;
    if (regex_match(line, literal, literalReg)) {

        int value = literalToDecimal(line);
        processWordHelper(value);
        locationCounter += 2;
        return;
    }
    smatch symbol;
    if (symbolTable.find(line) == symbolTable.end()) throw NotDefWordSecondPassError();
    if (regex_match(line, symbol, symbolReg)) {

        if (symbolTable.find(line) == symbolTable.end()) throw NotDefSymbol();

        if (symbolTable.find(line)->second.section == -1) {

            int value = symbolTable.find(line)->second.value;
            processWordHelper(value);
            locationCounter += 2;
            return;

        }

        if (!(symbolTable.find(line)->second.isGlobal)) {

            int value = symbolTable.find(line)->second.value;
            processWordHelper(value);
            relocationTableEntry rT = relocationTableEntry();
            rT.offset = locationCounter;
            locationCounter += 2;
            rT.typeOfRelocation = "R_386_16";
            rT.value = symbolTable.find(line)->second.section;
            relocationTable[currentSectionName].push_back(rT);
            return;

        } else {
            processWordHelper(0);
            relocationTableEntry rT = relocationTableEntry();
            rT.offset = locationCounter;
            rT.typeOfRelocation = "R_386_16";
            rT.value = symbolTable.find(line)->second.id;
            relocationTable[currentSectionName].push_back(rT);
            locationCounter += 2;
            return;

        }
    }

    throw AfterWordError();


}